

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O1

void __thiscall sf::priv::ClipboardImpl::processEventsImpl(ClipboardImpl *this)

{
  iterator *piVar1;
  int iVar2;
  _Elt_pointer p_Var3;
  XEvent event;
  _XEvent _Stack_e8;
  
  iVar2 = XCheckIfEvent(this->m_display,&_Stack_e8,anon_unknown.dwarf_a0d72::checkEvent,
                        this->m_window);
  if (iVar2 != 0) {
    do {
      p_Var3 = (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (p_Var3 == (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<_XEvent,std::allocator<_XEvent>>::_M_push_back_aux<_XEvent_const&>
                  ((deque<_XEvent,std::allocator<_XEvent>> *)&this->m_events,&_Stack_e8);
      }
      else {
        memcpy(p_Var3,&_Stack_e8,0xc0);
        piVar1 = &(this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      iVar2 = XCheckIfEvent(this->m_display,&_Stack_e8,anon_unknown.dwarf_a0d72::checkEvent,
                            this->m_window);
    } while (iVar2 != 0);
  }
  p_Var3 = (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur != p_Var3) {
    do {
      memcpy(&_Stack_e8,p_Var3,0xc0);
      std::deque<_XEvent,_std::allocator<_XEvent>_>::pop_front(&this->m_events);
      processEvent(this,&_Stack_e8);
      p_Var3 = (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    } while ((this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != p_Var3);
  }
  return;
}

Assistant:

void ClipboardImpl::processEventsImpl()
{
    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
        m_events.push_back(event);

    // Handle the events for this window that we just picked out
    while (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop_front();
        processEvent(event);
    }
}